

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular-array.h
# Opt level: O3

reference __thiscall
wabt::CircularArray<wabt::Token,_2UL>::back(CircularArray<wabt::Token,_2UL> *this)

{
  if (this->size_ != 0) {
    return (reference)
           ((long)&(this->contents_)._M_elems[0].loc.filename.data_ +
           (ulong)((~(uint)this->size_ + (int)this->front_ & 1) << 6));
  }
  __assert_fail("index < size_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/circular-array.h"
                ,0x34,
                "reference wabt::CircularArray<wabt::Token, 2>::at(size_type) [T = wabt::Token, kCapacity = 2]"
               );
}

Assistant:

reference back() { return at(size_ - 1); }